

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall
lr_grammar::GrammarLR::get_follow_by_first
          (GrammarLR *this,int elemIndex,ExpressLR *express,int begin,
          vector<int,_std::allocator<int>_> *result)

{
  pointer a;
  bool bVar1;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> *result_local;
  int begin_local;
  ExpressLR *express_local;
  GrammarLR *pGStack_10;
  int elemIndex_local;
  GrammarLR *this_local;
  
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)result;
  express_local._4_4_ = elemIndex;
  pGStack_10 = this;
  std::vector<int,_std::allocator<int>_>::clear(result);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  piVar2 = base_grammar::Express::operator[](&express->super_Express,0);
  result_local._4_4_ = begin;
  if (*piVar2 == -1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(value_type *)((long)&express_local + 4));
  }
  else {
    for (; sVar3 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)express),
        (ulong)(long)result_local._4_4_ < sVar3; result_local._4_4_ = result_local._4_4_ + 1) {
      piVar2 = base_grammar::Express::operator[](&express->super_Express,result_local._4_4_);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->first,(long)*piVar2);
      bVar1 = public_tool::is_in_vector(pvVar4,-1);
      a = tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
      if (!bVar1) {
        piVar2 = base_grammar::Express::operator[](&express->super_Express,result_local._4_4_);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->first,(long)*piVar2);
        public_tool::connect_vector((vector<int,_std::allocator<int>_> *)a,pvVar4);
        break;
      }
      piVar2 = base_grammar::Express::operator[](&express->super_Express,result_local._4_4_);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->first,(long)*piVar2);
      clear_null(pvVar4,(vector<int,_std::allocator<int>_> *)local_48,-1);
      public_tool::connect_vector
                ((vector<int,_std::allocator<int>_> *)
                 tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_48);
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)express);
    if ((long)result_local._4_4_ == sVar3) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,(value_type *)((long)&express_local + 4));
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void GrammarLR::get_follow_by_first(int elemIndex, ExpressLR express, int begin, vector<int>& result){
    result.clear();
    vector<int> tmp;

    //如果是一个空串的话
    if (express[0] == -1){
        result.push_back(elemIndex);
        return;
    }

    for (begin = begin; begin < express.expression.size(); begin++){

        //如果空不在退出
        if (!public_tool::is_in_vector(first[express[begin]], -1)){
            public_tool::connect_vector(result, first[express[begin]]);
            break;
        }
        else
        {
            clear_null(first[express[begin]], tmp);
            public_tool::connect_vector(result, tmp);
        }

    }
    if (begin == express.expression.size()){
        //result.push_back(-1);
        result.push_back(elemIndex);
    }

}